

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_end(nk_context *ctx)

{
  nk_property_state *__s;
  nk_edit_state *__s_00;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_panel_type nVar6;
  nk_color c;
  uint uVar7;
  nk_window *pnVar8;
  nk_panel *pnVar9;
  nk_panel *pnVar10;
  nk_window *pnVar11;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var12;
  undefined1 auVar13 [16];
  nk_vec2 nVar14;
  bool bVar15;
  nk_panel *pnVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  uint *puVar20;
  nk_panel *pnVar21;
  nk_page_element *pe;
  nk_window *pnVar22;
  nk_context *in;
  ulong uVar23;
  nk_command_buffer *b;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  nk_style *local_148;
  nk_flags *local_130;
  nk_flags local_11c;
  nk_vec2 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  nk_rect local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  nk_rect local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x492f,"void nk_end(struct nk_context *)");
  }
  pnVar8 = ctx->current;
  if (pnVar8 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4930,"void nk_end(struct nk_context *)");
  }
  pnVar9 = pnVar8->layout;
  if (pnVar9 == (nk_panel *)0x0) goto LAB_0012d278;
  nVar6 = pnVar9->type;
  if (nVar6 == NK_PANEL_WINDOW) {
    if ((pnVar8->flags & 0x2000) != 0) goto LAB_0012d278;
    in = (nk_context *)0x0;
    if ((pnVar9->flags & 0x1400) == 0) {
      in = ctx;
    }
LAB_0012c43d:
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar8->buffer,r);
    nVar6 = pnVar9->type;
    uVar18 = pnVar9->flags;
  }
  else {
    uVar18 = pnVar9->flags;
    in = (nk_context *)0x0;
    if ((uVar18 & 0x1400) == 0) {
      in = ctx;
    }
    if ((nVar6 & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
                 NK_PANEL_GROUP)) == 0) goto LAB_0012c43d;
  }
  local_130 = &pnVar9->flags;
  local_148 = &ctx->style;
  b = &pnVar8->buffer;
  local_118 = (ctx->style).window.scrollbar_size;
  uStack_110 = 0;
  nVar14 = nk_panel_get_padding(local_148,nVar6);
  auVar13._8_4_ = extraout_XMM0_Dc;
  auVar13._0_4_ = nVar14.x;
  auVar13._4_4_ = nVar14.y;
  auVar13._12_4_ = extraout_XMM0_Dd;
  fVar25 = (pnVar9->row).height + pnVar9->at_y;
  pnVar9->at_y = fVar25;
  local_108 = auVar13;
  if ((uVar18 & 0x8800) == 0x800) {
    fVar26 = (pnVar9->bounds).y;
    if (fVar25 < (pnVar9->bounds).h + fVar26) {
      (pnVar9->bounds).h = fVar25 - fVar26;
    }
    local_108._4_4_ = nVar14.y;
    rect.y = fVar26;
    rect.x = (pnVar8->bounds).x;
    rect.h = (float)local_108._4_4_;
    rect.w = (pnVar8->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar9->border + (float)local_108._0_4_;
    rect_00.y = (pnVar9->bounds).y;
    rect_00.x = (pnVar8->bounds).x;
    rect_00.h = (pnVar9->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar9->bounds).x + (pnVar9->bounds).w) - pnVar9->border;
    fVar25 = pnVar9->border + (float)local_108._0_4_;
    if ((*pnVar9->offset_y == 0) && ((*local_130 & 0x20) == 0)) {
      fVar25 = fVar25 + local_118.x;
    }
    rect_01.y = (pnVar9->bounds).y;
    rect_01.h = (pnVar9->bounds).h;
    rect_01.w = fVar25;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    uVar18 = pnVar9->flags;
    if ((uVar18 & 0x20) == 0 && *pnVar9->offset_x != 0) {
      rect_02.y = (pnVar9->bounds).y + (pnVar9->bounds).h;
      rect_02.x = (pnVar8->bounds).x;
      rect_02.h = local_118.y;
      rect_02.w = (pnVar8->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      uVar18 = pnVar9->flags;
    }
  }
  if (((uVar18 & 0x8020) == 0) &&
     (pnVar8->scrollbar_hiding_timer <= 4.0 && pnVar8->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar9->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar8 == ctx->active) {
        bVar24 = pnVar9->has_scrolling != 0;
      }
      else {
        bVar24 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar15 = bVar24;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar15 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar24);
        }
        if (bVar15 != false) {
          pnVar8->scrolled = 1;
          goto LAB_0012c757;
        }
      }
      pnVar8->scrolled = 0;
    }
    else {
      pnVar10 = pnVar8->layout;
      pnVar16 = pnVar10;
      do {
        pnVar21 = pnVar16;
        pnVar16 = pnVar21->parent;
        pnVar11 = pnVar8;
      } while (pnVar21->parent != (nk_panel *)0x0);
      do {
        pnVar22 = pnVar11;
        pnVar11 = pnVar22->parent;
      } while (pnVar11 != (nk_window *)0x0);
      if (((pnVar22 == ctx->active) && (pnVar9->has_scrolling != 0)) && (in != (nk_context *)0x0)) {
        uVar2 = (pnVar9->bounds).x;
        uVar4 = (pnVar9->bounds).y;
        fVar25 = (in->input).mouse.pos.x;
        bVar24 = false;
        if ((float)uVar2 <= fVar25) {
          uVar3 = (pnVar9->bounds).w;
          uVar5 = (pnVar9->bounds).h;
          if (fVar25 < (float)uVar2 + (float)uVar3) {
            fVar25 = (in->input).mouse.pos.y;
            bVar24 = false;
            if (((float)uVar4 <= fVar25) && (fVar25 < (float)uVar4 + (float)uVar5)) {
              fVar25 = (pnVar21->clip).x;
              if ((((float)uVar2 + (float)uVar3 < fVar25) ||
                  ((fVar25 + (pnVar21->clip).w < (float)uVar2 ||
                   (fVar25 = (pnVar21->clip).y, (float)uVar4 + (float)uVar5 < fVar25)))) ||
                 (fVar25 + (pnVar21->clip).h < (float)uVar4)) goto LAB_0012c620;
              for (pnVar16 = pnVar10->parent; pnVar16 != (nk_panel *)0x0; pnVar16 = pnVar16->parent)
              {
                pnVar10->has_scrolling = 0;
                pnVar10 = pnVar16;
              }
              pnVar10->has_scrolling = 0;
              bVar24 = true;
            }
          }
        }
      }
      else {
LAB_0012c620:
        bVar24 = false;
      }
    }
LAB_0012c757:
    local_f8._0_8_ = local_f8._0_8_ & 0xffffffff00000000;
    fVar25 = (pnVar9->bounds).y;
    scroll.x = (pnVar9->bounds).x + (pnVar9->bounds).w + (float)local_108._0_4_;
    fVar26 = (pnVar9->bounds).h;
    scroll.y = fVar25;
    scroll.h = fVar26;
    scroll.w = local_118.x;
    fVar25 = nk_do_scrollbarv((nk_flags *)&local_f8,b,scroll,(uint)bVar24,(float)*pnVar9->offset_y,
                              (float)(int)(pnVar9->at_y - fVar25),fVar26 * 0.1,fVar26 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar9->offset_y = (nk_uint)(long)fVar25;
    if ((in != (nk_context *)0x0) && (bVar24 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_11c = 0;
    fVar25 = (pnVar9->bounds).x;
    fVar30 = (pnVar9->bounds).y + (pnVar9->bounds).h;
    fVar26 = pnVar9->max_x;
    fVar28 = (float)(int)(fVar26 - fVar25);
    font = (ctx->style).font;
    local_f8.h = 1.0;
    if (1.0 <= local_118.y) {
      local_f8.h = local_118.y;
    }
    fVar31 = local_f8.h + local_f8.h;
    fVar27 = (pnVar9->bounds).w;
    local_f8.w = fVar31;
    if (fVar31 <= fVar27) {
      local_f8.w = fVar27;
    }
    local_f8._0_8_ = CONCAT44(fVar30,fVar25);
    fVar27 = 0.0;
    if (local_f8.w < fVar28) {
      fVar29 = (float)*pnVar9->offset_x;
      fVar27 = fVar26 * 0.05;
      local_c8 = ZEXT416((uint)fVar28);
      local_e8._0_4_ = local_f8.w;
      local_e8._4_4_ = 0;
      local_e8._8_4_ = 0;
      local_e8._12_4_ = 0;
      local_d8._4_4_ = 0;
      local_d8._8_4_ = 0;
      local_d8._12_4_ = 0;
      local_50.y = fVar30;
      local_50.h = local_f8.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_78 = ZEXT416((uint)fVar31);
        local_a8 = ZEXT416((uint)fVar30);
        local_e8 = ZEXT416((uint)local_f8.w);
        local_d8 = ZEXT416((uint)fVar25);
        fVar28 = fVar27;
        if (fVar26 * 0.005 <= fVar27) {
          fVar28 = fVar26 * 0.005;
        }
        local_98 = ZEXT416((uint)local_f8.h);
        local_68 = CONCAT44(fVar30,fVar25);
        uStack_60 = 0;
        bounds.y = fVar30;
        bounds.x = fVar25;
        bounds.h = local_f8.h;
        bounds.w = local_f8.h;
        local_88 = local_f8.h;
        fStack_84 = local_f8.h;
        fStack_80 = local_f8.h;
        fStack_7c = local_f8.h;
        iVar17 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar25 = 0.0;
        if (iVar17 != 0) {
          fVar25 = fVar28;
        }
        fVar29 = fVar29 - fVar25;
        fVar25 = (float)local_d8._0_4_ + (float)local_e8._0_4_;
        local_e8._0_4_ = (float)local_e8._0_4_ - (float)local_78._0_4_;
        bounds_00.h = fStack_84;
        bounds_00.w = local_88;
        bounds_00.y = (float)local_68._4_4_;
        bounds_00.x = fVar25 - (float)local_98._0_4_;
        iVar17 = nk_do_button_symbol((nk_flags *)&local_b8,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar17 != 0) {
          fVar29 = fVar29 + fVar28;
        }
        fVar25 = (float)local_d8._0_4_ + (float)local_98._0_4_;
        local_f8.x = fVar25;
        fVar28 = (float)local_c8._0_4_;
        local_50.y = (float)local_a8._0_4_;
        local_50.h = (float)local_98._0_4_;
      }
      if ((float)local_e8._0_4_ <= fVar27) {
        fVar27 = (float)local_e8._0_4_;
      }
      if (fVar28 - (float)local_e8._0_4_ <= fVar29) {
        fVar29 = fVar28 - (float)local_e8._0_4_;
      }
      fVar26 = 0.0;
      if (0.0 <= fVar29) {
        fVar26 = fVar29;
      }
      fVar30 = (ctx->style).scrollh.border;
      nVar14 = (ctx->style).scrollh.padding;
      fVar31 = nVar14.x;
      fVar29 = nVar14.y;
      local_b8.x = (fVar26 / fVar28) * (float)local_e8._0_4_ + fVar25 + fVar30 + fVar31;
      local_b8.y = local_50.y + fVar30 + fVar29;
      local_b8.w = ((float)local_e8._0_4_ / fVar28) * (float)local_e8._0_4_ -
                   (fVar31 + fVar31 + fVar30 + fVar30);
      local_b8.h = local_50.h - (fVar29 + fVar29 + fVar30 + fVar30);
      local_d8._0_4_ = fVar25;
      local_50.x = local_b8.w + local_b8.x;
      local_40.w = local_b8.x - fVar25;
      local_50.w = (fVar25 + (float)local_e8._0_4_) - local_50.x;
      local_f8.w = (float)local_e8._0_4_;
      local_40.x = fVar25;
      local_40.y = local_50.y;
      local_40.h = local_50.h;
      fVar27 = nk_scrollbar_behavior
                         (&local_11c,&in->input,(uint)bVar24,&local_f8,&local_b8,&local_40,&local_50
                          ,fVar26,fVar28,fVar27,NK_HORIZONTAL);
      local_b8.x = (fVar27 / (float)local_c8._0_4_) * (float)local_e8._0_4_ + (float)local_d8._0_4_;
      p_Var12 = (ctx->style).scrollh.draw_begin;
      if (p_Var12 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var12)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_11c,&(ctx->style).scrollh,&local_f8,&local_b8);
      p_Var12 = (ctx->style).scrollh.draw_end;
      if (p_Var12 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var12)(b,(ctx->style).scrollh.userdata);
      }
    }
    *pnVar9->offset_x = (nk_uint)(long)fVar27;
  }
  if ((pnVar8->flags & 0x80) == 0) {
LAB_0012cbfd:
    pnVar8->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar25 = (ctx->input).mouse.delta.x;
    if ((((fVar25 != 0.0) || (NAN(fVar25))) || (fVar25 = (ctx->input).mouse.delta.y, fVar25 != 0.0))
       || (NAN(fVar25))) {
      iVar17 = nk_window_is_hovered(ctx);
      bVar24 = iVar17 != 0;
LAB_0012cc3c:
      if ((bVar24) || ((ctx->last_widget_state & 2) != 0)) goto LAB_0012cbfd;
    }
    else {
      fVar25 = (ctx->input).mouse.scroll_delta.y;
      iVar17 = nk_window_is_hovered(ctx);
      bVar24 = iVar17 != 0;
      if (fVar25 != 0.0 || !bVar24) goto LAB_0012cc3c;
    }
    pnVar8->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar8->scrollbar_hiding_timer;
  }
  uVar18 = *local_130;
  if ((uVar18 & 1) != 0) {
    nVar6 = pnVar9->type;
    lVar19 = 0x1cc4;
    if ((int)nVar6 < 0x20) {
      if (nVar6 == NK_PANEL_GROUP) {
        lVar19 = 0x1cd8;
      }
      else if (nVar6 == NK_PANEL_POPUP) {
        lVar19 = 0x1cc8;
      }
      else if (nVar6 == NK_PANEL_CONTEXTUAL) {
        lVar19 = 0x1cd0;
      }
    }
    else if (nVar6 == NK_PANEL_COMBO) {
      lVar19 = 0x1ccc;
    }
    else if ((nVar6 == NK_PANEL_MENU) || (nVar6 == NK_PANEL_TOOLTIP)) {
      lVar19 = 0x1cd4;
    }
    c = *(nk_color *)((long)local_148->cursors + lVar19 + -8);
    if ((short)uVar18 < 0) {
      fVar25 = (pnVar8->bounds).y;
      fVar26 = (ctx->style).window.border + fVar25 + pnVar9->header_height;
    }
    else if ((uVar18 >> 0xb & 1) == 0) {
      fVar25 = (pnVar8->bounds).y;
      fVar26 = (pnVar8->bounds).h + fVar25;
    }
    else {
      fVar26 = (pnVar9->bounds).y + (pnVar9->bounds).h + pnVar9->footer_height;
      fVar25 = (pnVar8->bounds).y;
    }
    fVar28 = (pnVar8->bounds).x;
    nk_stroke_line(b,fVar28,fVar25,(pnVar8->bounds).w + fVar28,fVar25,pnVar9->border,c);
    fVar25 = (pnVar8->bounds).x;
    nk_stroke_line(b,fVar25,fVar26,(pnVar8->bounds).w + fVar25,fVar26,pnVar9->border,c);
    fVar25 = pnVar9->border * 0.5 + (pnVar8->bounds).x;
    nk_stroke_line(b,fVar25,(pnVar8->bounds).y,fVar25,fVar26,pnVar9->border,c);
    fVar25 = ((pnVar8->bounds).x + (pnVar8->bounds).w) - pnVar9->border * 0.5;
    nk_stroke_line(b,fVar25,(pnVar8->bounds).y,fVar25,fVar26,pnVar9->border,c);
    uVar18 = pnVar9->flags;
  }
  if ((in != (nk_context *)0x0) && ((uVar18 & 0x8004) == 4)) {
    fVar25 = (pnVar9->bounds).x;
    fVar26 = (pnVar9->bounds).y + (pnVar9->bounds).h;
    if ((uVar18 >> 9 & 1) == 0) {
      local_108._0_4_ = fVar25 + (pnVar9->bounds).w + (float)local_108._0_4_;
    }
    else {
      local_108._0_4_ = fVar25 + (float)local_108._0_4_ * -0.5;
    }
    if ((uVar18 & 0x20) != 0) {
      local_108._0_4_ = (float)local_108._0_4_ - local_118.x;
    }
    local_108._4_4_ = fVar26;
    local_108._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar26;
      r_00.x = (float)local_108._0_4_;
      r_00.w = local_118.x;
      r_00.h = local_118.y;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar28 = local_118.x + (float)local_108._0_4_;
      fVar25 = (float)local_108._0_4_;
      if ((uVar18 >> 9 & 1) == 0) {
        fVar25 = fVar28;
        fVar28 = (float)local_108._0_4_;
      }
      nk_fill_triangle(b,fVar25,fVar26,fVar25,local_118.y + fVar26,fVar28,local_118.y + fVar26,
                       (ctx->style).window.scaler.data.color);
    }
    if (((((pnVar8->flags & 0x1000) == 0) &&
         (fVar25 = (in->input).mouse.buttons[0].clicked_pos.x, (float)local_108._0_4_ <= fVar25)) &&
        (fVar25 < local_118.x + (float)local_108._0_4_)) &&
       (((fVar25 = (in->input).mouse.buttons[0].clicked_pos.y, (float)local_108._4_4_ <= fVar25 &&
         (fVar25 < local_118.y + (float)local_108._4_4_)) &&
        ((in->input).mouse.buttons[0].down == 1)))) {
      fVar25 = (ctx->style).window.min_size.x;
      fVar26 = (ctx->style).window.min_size.y;
      fVar28 = (in->input).mouse.delta.x;
      uVar18 = *local_130;
      fVar30 = fVar28;
      if ((uVar18 >> 9 & 1) != 0) {
        fVar30 = -fVar28;
        (pnVar8->bounds).x = (pnVar8->bounds).x + fVar28;
      }
      fVar31 = (pnVar8->bounds).w + fVar30;
      fVar27 = (float)local_108._0_4_;
      if ((fVar25 <= fVar31) &&
         ((fVar30 < 0.0 || ((0.0 < fVar30 && ((float)local_108._0_4_ <= (in->input).mouse.pos.x)))))
         ) {
        (pnVar8->bounds).w = fVar31;
        fVar27 = fVar28 + (float)local_108._0_4_;
      }
      fVar25 = (float)local_108._4_4_;
      if ((uVar18 >> 0xb & 1) == 0) {
        fVar28 = (in->input).mouse.delta.y;
        fVar30 = (pnVar8->bounds).h + fVar28;
        if ((fVar26 < fVar30) &&
           ((fVar28 < 0.0 || ((0.0 < fVar28 && ((float)local_108._4_4_ <= (in->input).mouse.pos.y)))
            ))) {
          (pnVar8->bounds).h = fVar30;
          fVar25 = fVar28 + (float)local_108._4_4_;
        }
      }
      (ctx->style).cursor_active = (ctx->style).cursors[6];
      nVar14.y = local_118.y * 0.5 + fVar25;
      nVar14.x = local_118.x * 0.5 + fVar27;
      (in->input).mouse.buttons[0].clicked_pos = nVar14;
    }
  }
  uVar18 = pnVar9->flags;
  if ((pnVar9->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((uVar18 >> 0xd & 1) == 0) {
      (pnVar8->buffer).end = (ctx->memory).allocated;
      if ((pnVar8->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar8->popup).buf.parent + 8) =
             (pnVar8->popup).buf.end;
      }
    }
    else {
      (pnVar8->buffer).begin = 0;
      (pnVar8->buffer).end = 0;
      (pnVar8->buffer).last = 0;
      (pnVar8->buffer).clip = nk_null_rect;
      uVar18 = *local_130;
    }
  }
  if ((uVar18 >> 0x10 & 1) != 0) {
    uVar18 = uVar18 & 0xfffeefff;
    *local_130 = uVar18;
  }
  pnVar8->flags = uVar18;
  iVar17 = (pnVar8->property).active;
  if (iVar17 == 0) {
    uVar18 = (pnVar8->property).seq;
LAB_0012d156:
    (pnVar8->property).old = uVar18;
    (pnVar8->property).prev = iVar17;
    (pnVar8->property).seq = 0;
  }
  else {
    uVar7 = (pnVar8->property).seq;
    uVar18 = (pnVar8->property).old;
    if ((uVar18 == uVar7) || (uVar18 = uVar7, iVar17 != (pnVar8->property).prev)) goto LAB_0012d156;
    __s = &pnVar8->property;
    uVar23 = (ulong)__s & 3;
    if (uVar23 == 0) {
      (pnVar8->property).select_start = 0;
      (pnVar8->property).select_end = 0;
      (pnVar8->property).name = 0;
      (pnVar8->property).seq = 0;
      (pnVar8->property).buffer[0x38] = '\0';
      (pnVar8->property).buffer[0x39] = '\0';
      (pnVar8->property).buffer[0x3a] = '\0';
      (pnVar8->property).buffer[0x3b] = '\0';
      (pnVar8->property).buffer[0x3c] = '\0';
      (pnVar8->property).buffer[0x3d] = '\0';
      (pnVar8->property).buffer[0x3e] = '\0';
      (pnVar8->property).buffer[0x3f] = '\0';
      (pnVar8->property).length = 0;
      (pnVar8->property).cursor = 0;
      (pnVar8->property).buffer[0x28] = '\0';
      (pnVar8->property).buffer[0x29] = '\0';
      (pnVar8->property).buffer[0x2a] = '\0';
      (pnVar8->property).buffer[0x2b] = '\0';
      (pnVar8->property).buffer[0x2c] = '\0';
      (pnVar8->property).buffer[0x2d] = '\0';
      (pnVar8->property).buffer[0x2e] = '\0';
      (pnVar8->property).buffer[0x2f] = '\0';
      (pnVar8->property).buffer[0x30] = '\0';
      (pnVar8->property).buffer[0x31] = '\0';
      (pnVar8->property).buffer[0x32] = '\0';
      (pnVar8->property).buffer[0x33] = '\0';
      (pnVar8->property).buffer[0x34] = '\0';
      (pnVar8->property).buffer[0x35] = '\0';
      (pnVar8->property).buffer[0x36] = '\0';
      (pnVar8->property).buffer[0x37] = '\0';
      (pnVar8->property).buffer[0x18] = '\0';
      (pnVar8->property).buffer[0x19] = '\0';
      (pnVar8->property).buffer[0x1a] = '\0';
      (pnVar8->property).buffer[0x1b] = '\0';
      (pnVar8->property).buffer[0x1c] = '\0';
      (pnVar8->property).buffer[0x1d] = '\0';
      (pnVar8->property).buffer[0x1e] = '\0';
      (pnVar8->property).buffer[0x1f] = '\0';
      (pnVar8->property).buffer[0x20] = '\0';
      (pnVar8->property).buffer[0x21] = '\0';
      (pnVar8->property).buffer[0x22] = '\0';
      (pnVar8->property).buffer[0x23] = '\0';
      (pnVar8->property).buffer[0x24] = '\0';
      (pnVar8->property).buffer[0x25] = '\0';
      (pnVar8->property).buffer[0x26] = '\0';
      (pnVar8->property).buffer[0x27] = '\0';
      (pnVar8->property).buffer[8] = '\0';
      (pnVar8->property).buffer[9] = '\0';
      (pnVar8->property).buffer[10] = '\0';
      (pnVar8->property).buffer[0xb] = '\0';
      (pnVar8->property).buffer[0xc] = '\0';
      (pnVar8->property).buffer[0xd] = '\0';
      (pnVar8->property).buffer[0xe] = '\0';
      (pnVar8->property).buffer[0xf] = '\0';
      (pnVar8->property).buffer[0x10] = '\0';
      (pnVar8->property).buffer[0x11] = '\0';
      (pnVar8->property).buffer[0x12] = '\0';
      (pnVar8->property).buffer[0x13] = '\0';
      (pnVar8->property).buffer[0x14] = '\0';
      (pnVar8->property).buffer[0x15] = '\0';
      (pnVar8->property).buffer[0x16] = '\0';
      (pnVar8->property).buffer[0x17] = '\0';
      __s->active = 0;
      __s->prev = 0;
      (pnVar8->property).buffer[0] = '\0';
      (pnVar8->property).buffer[1] = '\0';
      (pnVar8->property).buffer[2] = '\0';
      (pnVar8->property).buffer[3] = '\0';
      (pnVar8->property).buffer[4] = '\0';
      (pnVar8->property).buffer[5] = '\0';
      (pnVar8->property).buffer[6] = '\0';
      (pnVar8->property).buffer[7] = '\0';
      (pnVar8->property).old = 0;
      (pnVar8->property).state = 0;
    }
    else {
      memset(__s,0,4 - uVar23);
      puVar1 = (undefined8 *)((long)__s + (4 - uVar23));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      *(undefined4 *)(puVar1 + 0xc) = 0;
      memset((void *)((long)puVar1 + 100),0,uVar23);
    }
  }
  iVar17 = (pnVar8->edit).active;
  if (iVar17 == 0) {
    uVar18 = (pnVar8->edit).seq;
LAB_0012d1ef:
    (pnVar8->edit).old = uVar18;
    (pnVar8->edit).prev = iVar17;
    (pnVar8->edit).seq = 0;
  }
  else {
    uVar7 = (pnVar8->edit).seq;
    uVar18 = (pnVar8->edit).old;
    if ((uVar18 == uVar7) || (uVar18 = uVar7, iVar17 != (pnVar8->edit).prev)) goto LAB_0012d1ef;
    __s_00 = &pnVar8->edit;
    uVar23 = (ulong)__s_00 & 3;
    if (uVar23 == 0) {
      (pnVar8->edit).sel_end = 0;
      (pnVar8->edit).scrollbar.x = 0;
      *(undefined8 *)&(pnVar8->edit).scrollbar.y = 0;
      (pnVar8->edit).prev = 0;
      (pnVar8->edit).cursor = 0;
      (pnVar8->edit).sel_start = 0;
      (pnVar8->edit).sel_end = 0;
      __s_00->name = 0;
      __s_00->seq = 0;
      (pnVar8->edit).old = 0;
      (pnVar8->edit).active = 0;
    }
    else {
      memset(__s_00,0,4 - uVar23);
      puVar1 = (undefined8 *)((long)__s_00 + (4 - uVar23));
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1[2] = 0;
      puVar1[3] = 0;
      puVar1[4] = 0;
      memset(puVar1 + 5,0,uVar23);
    }
  }
  if ((pnVar8->popup).active_con == 0) {
    uVar18 = (pnVar8->popup).con_count;
LAB_0012d23d:
    puVar20 = &(pnVar8->popup).con_count;
    (pnVar8->popup).con_old = uVar18;
  }
  else {
    uVar18 = (pnVar8->popup).con_old;
    if (uVar18 == (pnVar8->popup).con_count) goto LAB_0012d23d;
    puVar20 = &(pnVar8->popup).active_con;
    (pnVar8->popup).con_count = 0;
    (pnVar8->popup).con_old = 0;
  }
  *puVar20 = 0;
  (pnVar8->popup).combo_count = 0;
  if ((pnVar9->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x474a,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012d278:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}